

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageFederate::getMessage(MessageFederate *this)

{
  Modes MVar1;
  _Head_base<0UL,_helics::Message_*,_false> in_RDI;
  MessageFederateManager *in_stack_00000088;
  _Head_base<0UL,_helics::Message_*,_false> this_00;
  
  this_00._M_head_impl = in_RDI._M_head_impl;
  MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x2ae724);
  if ((char)MVar1 < '\x01') {
    std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
    unique_ptr<std::default_delete<helics::Message>,void>
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               this_00._M_head_impl,in_RDI._M_head_impl);
  }
  else {
    std::
    unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
    ::operator->((unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
                  *)0x2ae736);
    MessageFederateManager::getMessage(in_stack_00000088);
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)this_00._M_head_impl;
}

Assistant:

std::unique_ptr<Message> MessageFederate::getMessage()
{
    if (currentMode >= Modes::INITIALIZING) {
        return mfManager->getMessage();
    }
    return nullptr;
}